

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O2

char * align_str(aligntyp alignment)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,alignment);
  if (iVar1 == -0x80) {
    return "unaligned";
  }
  if (iVar1 == -1) {
    return "chaotic";
  }
  if (iVar1 == 1) {
    return "lawful";
  }
  if (iVar1 == 0) {
    return "neutral";
  }
  return "unknown";
}

Assistant:

const char * align_str(aligntyp alignment)
{
    switch ((int)alignment) {
	case A_CHAOTIC: return "chaotic";
	case A_NEUTRAL: return "neutral";
	case A_LAWFUL:	return "lawful";
	case A_NONE:	return "unaligned";
    }
    return "unknown";
}